

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::Checkbox(char *label,bool *v)

{
  ImDrawList *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImU32 IVar3;
  ImGuiWindow *this_00;
  float fVar4;
  ImVec2 pos;
  float fVar5;
  char *local_1b8;
  ImGuiCol local_180;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  float local_f0;
  float local_ec;
  float pad;
  float check_sz;
  ImVec2 local_e0;
  byte local_d7;
  bool local_d6;
  bool local_d5;
  bool pressed;
  bool held;
  ImVec2 IStack_d4;
  bool hovered;
  ImVec2 local_cc;
  ImRect local_c4;
  ImVec2 local_b4;
  ImVec2 local_ac;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  undefined1 local_84 [8];
  ImRect text_bb;
  ImRect total_bb;
  ImVec2 local_5c;
  undefined1 local_54 [8];
  ImRect check_bb;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  bool *v_local;
  char *label_local;
  
  this_00 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((this_00->SkipItems & 1U) == 0) {
    register0x00000000 = &GImGui->Style;
    label_size.x = (float)ImGuiWindow::GetID(this_00,label,(char *)0x0);
    check_bb.Max = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar5 = (stack0xffffffffffffffc8->FramePadding).y;
    fVar5 = fVar5 + fVar5 + check_bb.Max.y;
    ImVec2::ImVec2(&total_bb.Max,fVar5,fVar5);
    local_5c = ::operator+(&(this_00->DC).CursorPos,&total_bb.Max);
    ImRect::ImRect((ImRect *)local_54,&(this_00->DC).CursorPos,&local_5c);
    ItemSize((ImRect *)local_54,(stack0xffffffffffffffc8->FramePadding).y);
    text_bb.Max.x = (float)local_54._0_4_;
    text_bb.Max.y = (float)local_54._4_4_;
    total_bb.Min = check_bb.Min;
    if (0.0 < check_bb.Max.x) {
      SameLine(0.0,(stack0xffffffffffffffc8->ItemInnerSpacing).x);
    }
    ImVec2::ImVec2(&local_94,0.0,(stack0xffffffffffffffc8->FramePadding).y);
    local_8c = ::operator+(&(this_00->DC).CursorPos,&local_94);
    ImVec2::ImVec2(&local_ac,0.0,(stack0xffffffffffffffc8->FramePadding).y);
    local_a4 = ::operator+(&(this_00->DC).CursorPos,&local_ac);
    local_9c = ::operator+(&local_a4,&check_bb.Max);
    ImRect::ImRect((ImRect *)local_84,&local_8c,&local_9c);
    if (0.0 < check_bb.Max.x) {
      fVar5 = ImRect::GetWidth((ImRect *)local_84);
      fVar4 = ImRect::GetHeight((ImRect *)local_54);
      ImVec2::ImVec2(&local_b4,fVar5,fVar4);
      ItemSize(&local_b4,(stack0xffffffffffffffc8->FramePadding).y);
      local_cc = ImMin((ImVec2 *)local_54,(ImVec2 *)local_84);
      IStack_d4 = ImMax(&check_bb.Min,&text_bb.Min);
      ImRect::ImRect(&local_c4,&local_cc,&stack0xffffffffffffff2c);
      text_bb.Max = local_c4.Min;
      total_bb.Min = local_c4.Max;
    }
    bVar2 = ItemAdd((ImRect *)&text_bb.Max,(ImGuiID *)&label_size);
    if (bVar2) {
      local_d7 = ButtonBehavior((ImRect *)&text_bb.Max,(ImGuiID)label_size.x,&local_d5,&local_d6,0);
      if ((bool)local_d7) {
        *v = (bool)((*v ^ 0xffU) & 1);
      }
      local_e0.x = (float)local_54._0_4_;
      local_e0.y = (float)local_54._4_4_;
      _pad = check_bb.Min;
      if (((local_d6 & 1U) == 0) || ((local_d5 & 1U) == 0)) {
        local_180 = 7;
        if ((local_d5 & 1U) != 0) {
          local_180 = 8;
        }
      }
      else {
        local_180 = 9;
      }
      IVar3 = GetColorU32(local_180,1.0);
      RenderFrame(local_e0,_pad,IVar3,true,stack0xffffffffffffffc8->FrameRounding);
      if ((*v & 1U) != 0) {
        fVar5 = ImRect::GetWidth((ImRect *)local_54);
        fVar4 = ImRect::GetHeight((ImRect *)local_54);
        local_ec = ImMin(fVar5,fVar4);
        local_f0 = ImMax(1.0,(float)(int)(local_ec / 6.0));
        this = this_00->DrawList;
        ImVec2::ImVec2(&local_100,local_f0,local_f0);
        local_f8 = ::operator+((ImVec2 *)local_54,&local_100);
        ImVec2::ImVec2(&local_110,local_f0,local_f0);
        local_108 = ::operator-(&check_bb.Min,&local_110);
        IVar3 = GetColorU32(0x13,1.0);
        ImDrawList::AddRectFilled
                  (this,&local_f8,&local_108,IVar3,stack0xffffffffffffffc8->FrameRounding,0xf);
      }
      if ((pIVar1->LogEnabled & 1U) != 0) {
        local_118 = ImRect::GetTL((ImRect *)local_84);
        if ((*v & 1U) == 0) {
          local_1b8 = "[ ]";
        }
        else {
          local_1b8 = "[x]";
        }
        LogRenderedText(&local_118,local_1b8,(char *)0x0);
      }
      if (0.0 < check_bb.Max.x) {
        pos = ImRect::GetTL((ImRect *)local_84);
        RenderText(pos,label,(char *)0x0,true);
      }
      label_local._7_1_ = (bool)(local_d7 & 1);
    }
    else {
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::Checkbox(const char* label, bool* v)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    const ImRect check_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(label_size.y + style.FramePadding.y*2, label_size.y + style.FramePadding.y*2));
    ItemSize(check_bb, style.FramePadding.y);

    ImRect total_bb = check_bb;
    if (label_size.x > 0)
        SameLine(0, style.ItemInnerSpacing.x);
    const ImRect text_bb(window->DC.CursorPos + ImVec2(0,style.FramePadding.y), window->DC.CursorPos + ImVec2(0,style.FramePadding.y) + label_size);
    if (label_size.x > 0)
    {
        ItemSize(ImVec2(text_bb.GetWidth(), check_bb.GetHeight()), style.FramePadding.y);
        total_bb = ImRect(ImMin(check_bb.Min, text_bb.Min), ImMax(check_bb.Max, text_bb.Max));
    }

    if (!ItemAdd(total_bb, &id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(total_bb, id, &hovered, &held);
    if (pressed)
        *v = !(*v);

    RenderFrame(check_bb.Min, check_bb.Max, GetColorU32((held && hovered) ? ImGuiCol_FrameBgActive : hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg), true, style.FrameRounding);
    if (*v)
    {
        const float check_sz = ImMin(check_bb.GetWidth(), check_bb.GetHeight());
        const float pad = ImMax(1.0f, (float)(int)(check_sz / 6.0f));
        window->DrawList->AddRectFilled(check_bb.Min+ImVec2(pad,pad), check_bb.Max-ImVec2(pad,pad), GetColorU32(ImGuiCol_CheckMark), style.FrameRounding);
    }

    if (g.LogEnabled)
        LogRenderedText(text_bb.GetTL(), *v ? "[x]" : "[ ]");
    if (label_size.x > 0.0f)
        RenderText(text_bb.GetTL(), label);

    return pressed;
}